

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache.h
# Opt level: O0

void __thiscall
CuckooCache::cache<uint256,_SignatureCacheHasher>::epoch_check
          (cache<uint256,_SignatureCacheHasher> *this)

{
  long lVar1;
  bool bVar2;
  uint *puVar3;
  _Bit_reference *in_RDI;
  long in_FS_OFFSET;
  uint32_t i_1;
  uint32_t i;
  uint32_t epoch_unused_count;
  cache<uint256,_SignatureCacheHasher> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint uVar4;
  uint local_58;
  uint local_54;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)&(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p == 0) {
    local_54 = 0;
    for (local_58 = 0; local_58 < (uint)in_RDI[1]._M_mask; local_58 = local_58 + 1) {
      std::vector<bool,_std::allocator<bool>_>::operator[]
                ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                 CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
      bVar2 = std::_Bit_reference::operator_cast_to_bool
                        ((_Bit_reference *)in_stack_ffffffffffffff88);
      in_stack_ffffffffffffff97 = 0;
      if (bVar2) {
        bVar2 = bit_packed_atomic_flags::bit_is_set
                          ((bit_packed_atomic_flags *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           (uint32_t)((ulong)in_RDI >> 0x20));
        in_stack_ffffffffffffff97 = bVar2 ^ 0xff;
      }
      local_54 = (in_stack_ffffffffffffff97 & 1) + local_54;
    }
    if (local_54 <
        *(uint *)((long)&(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4)) {
      std::max<unsigned_int>
                ((uint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                 (uint *)in_stack_ffffffffffffff88);
      puVar3 = std::max<unsigned_int>
                         ((uint *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                          (uint *)in_stack_ffffffffffffff88);
      *(uint *)&(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = *puVar3;
    }
    else {
      for (uVar4 = 0; uVar4 < (uint)in_RDI[1]._M_mask; uVar4 = uVar4 + 1) {
        std::vector<bool,_std::allocator<bool>_>::operator[]
                  ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                   CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
        bVar2 = std::_Bit_reference::operator_cast_to_bool
                          ((_Bit_reference *)in_stack_ffffffffffffff88);
        if (bVar2) {
          std::vector<bool,_std::allocator<bool>_>::operator[]
                    ((vector<bool,_std::allocator<bool>_> *)in_RDI,
                     CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
          std::_Bit_reference::operator=(in_RDI,(bool)in_stack_ffffffffffffff97);
        }
        else {
          allow_erase(in_stack_ffffffffffffff88,0);
        }
      }
      *(undefined4 *)
       &(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           *(undefined4 *)
            ((long)&(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 4);
    }
  }
  else {
    *(int *)&(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         *(int *)&(((_Bvector_base<std::allocator<bool>_> *)&in_RDI[5]._M_p)->_M_impl).
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void epoch_check()
    {
        if (epoch_heuristic_counter != 0) {
            --epoch_heuristic_counter;
            return;
        }
        // count the number of elements from the latest epoch which
        // have not been erased.
        uint32_t epoch_unused_count = 0;
        for (uint32_t i = 0; i < size; ++i)
            epoch_unused_count += epoch_flags[i] &&
                                  !collection_flags.bit_is_set(i);
        // If there are more non-deleted entries in the current epoch than the
        // epoch size, then allow_erase on all elements in the old epoch (marked
        // false) and move all elements in the current epoch to the old epoch
        // but do not call allow_erase on their indices.
        if (epoch_unused_count >= epoch_size) {
            for (uint32_t i = 0; i < size; ++i)
                if (epoch_flags[i])
                    epoch_flags[i] = false;
                else
                    allow_erase(i);
            epoch_heuristic_counter = epoch_size;
        } else
            // reset the epoch_heuristic_counter to next do a scan when worst
            // case behavior (no intermittent erases) would exceed epoch size,
            // with a reasonable minimum scan size.
            // Ordinarily, we would have to sanity check std::min(epoch_size,
            // epoch_unused_count), but we already know that `epoch_unused_count
            // < epoch_size` in this branch
            epoch_heuristic_counter = std::max(1u, std::max(epoch_size / 16,
                        epoch_size - epoch_unused_count));
    }